

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

int uv_timer_start(uv_timer_t *handle,uv_timer_cb cb,uint64_t timeout,uint64_t repeat)

{
  uint *puVar1;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uv_loop_t *puVar2;
  heap_node *parent;
  bool bVar3;
  anon_struct_16_2_d918446b_for_timer_heap *paVar4;
  anon_struct_16_2_d918446b_for_timer_heap *paVar5;
  anon_struct_16_2_d918446b_for_timer_heap *paVar6;
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  if (cb == (uv_timer_cb)0x0) {
    return -0x16;
  }
  if ((handle->flags & 4) != 0) {
    uv_timer_stop(handle);
  }
  puVar2 = handle->loop;
  uVar8 = 0xffffffffffffffff;
  if (!CARRY8(timeout,puVar2->time)) {
    uVar8 = timeout + puVar2->time;
  }
  handle->timer_cb = cb;
  handle->timeout = uVar8;
  handle->repeat = repeat;
  uVar8 = puVar2->timer_counter;
  puVar2->timer_counter = uVar8 + 1;
  handle->start_id = uVar8;
  handle->heap_node[0] = (void *)0x0;
  handle->heap_node[1] = (void *)0x0;
  handle->heap_node[2] = (void *)0x0;
  uVar7 = (puVar2->timer_heap).nelts + 1;
  uVar10 = 0;
  iVar9 = 0;
  if (1 < uVar7) {
    iVar9 = 0;
    uVar10 = 0;
    uVar11 = uVar7;
    do {
      uVar10 = (uVar11 & 1) + uVar10 * 2;
      iVar9 = iVar9 + 1;
      bVar3 = 3 < uVar11;
      uVar11 = uVar11 >> 1;
    } while (bVar3);
  }
  heap = &puVar2->timer_heap;
  paVar6 = heap;
  paVar5 = heap;
  for (; paVar4 = paVar6, iVar9 != 0; iVar9 = iVar9 + -1) {
    uVar11 = uVar10 * 8;
    uVar10 = uVar10 >> 1;
    paVar6 = (anon_struct_16_2_d918446b_for_timer_heap *)((ulong)(uVar11 & 8) + (long)paVar4->min);
    paVar5 = paVar4;
  }
  handle->heap_node[2] = paVar5->min;
  paVar4->min = handle->heap_node;
  (puVar2->timer_heap).nelts = uVar7;
  while (parent = (heap_node *)handle->heap_node[2], parent != (heap_node *)0x0) {
    if ((parent[1].left <= (heap_node *)handle->timeout) &&
       ((parent[1].left < (heap_node *)handle->timeout ||
        (parent[1].parent <= (heap_node *)handle->start_id)))) break;
    heap_node_swap((heap *)heap,parent,(heap_node *)handle->heap_node);
  }
  uVar10 = handle->flags;
  if (((uVar10 & 4) == 0) && (handle->flags = uVar10 | 4, (uVar10 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  return 0;
}

Assistant:

int uv_timer_start(uv_timer_t* handle,
                   uv_timer_cb cb,
                   uint64_t timeout,
                   uint64_t repeat) {
  uint64_t clamped_timeout;

  if (cb == NULL)
    return UV_EINVAL;

  if (uv__is_active(handle))
    uv_timer_stop(handle);

  clamped_timeout = handle->loop->time + timeout;
  if (clamped_timeout < timeout)
    clamped_timeout = (uint64_t) -1;

  handle->timer_cb = cb;
  handle->timeout = clamped_timeout;
  handle->repeat = repeat;
  /* start_id is the second index to be compared in uv__timer_cmp() */
  handle->start_id = handle->loop->timer_counter++;

  heap_insert(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_start(handle);

  return 0;
}